

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O3

void __thiscall Assimp::FBX::Node::DumpBinary(Node *this,StreamWriterLE *s)

{
  pointer pFVar1;
  pointer this_00;
  FBXExportProperty *p;
  pointer pFVar2;
  
  BeginBinary(this,s);
  this_00 = (this->properties).
            super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->properties).
           super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar2 = this_00;
  if (this_00 != pFVar1) {
    do {
      FBXExportProperty::DumpBinary(this_00,s);
      this_00 = this_00 + 1;
    } while (this_00 != pFVar1);
    this_00 = (this->properties).
              super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pFVar2 = (this->properties).
             super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  EndPropertiesBinary(this,s,(long)this_00 - (long)pFVar2 >> 5);
  DumpChildrenBinary(this,s);
  EndBinary(this,s,(bool)((this->children).
                          super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
                          _M_impl.super__Vector_impl_data._M_start !=
                          (this->children).
                          super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
                          _M_impl.super__Vector_impl_data._M_finish | this->force_has_children));
  return;
}

Assistant:

void FBX::Node::DumpBinary(Assimp::StreamWriterLE &s)
{
    // write header section (with placeholders for some things)
    BeginBinary(s);

    // write properties
    DumpPropertiesBinary(s);

    // go back and fill in property related placeholders
    EndPropertiesBinary(s, properties.size());

    // write children
    DumpChildrenBinary(s);

    // finish, filling in end offset placeholder
    EndBinary(s, force_has_children || !children.empty());
}